

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O0

void __thiscall
cppcms::session_pool::storage
          (session_pool *this,
          unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
          *s)

{
  unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  *in_RSI;
  unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  *in_stack_ffffffffffffffe8;
  
  std::
  unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  ::operator=(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void session_pool::storage(std::unique_ptr<sessions::session_storage_factory> s)
{
	storage_=std::move(s);
}